

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::reset(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  QEditorInfo *this_01;
  QWidget *editor;
  QWidget *editor_00;
  long in_FS_OFFSET;
  pair<const_QPersistentModelIndex_&,_const_QEditorInfo_&> pVar4;
  piter local_80;
  QHash<QPersistentModelIndex,_QEditorInfo> local_70;
  undefined1 local_68 [16];
  QAbstractItemView *pQStack_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  QBasicTimer::stop();
  local_70.d = (this_00->indexEditorHash).d;
  if ((local_70.d != (Data *)0x0) &&
     (((local_70.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_70.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_80 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::begin(&local_70);
  do {
    if ((local_80.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0) &&
       (local_80.bucket == 0)) {
      QHash<QWidget_*,_QPersistentModelIndex>::clear(&this_00->editorIndexHash);
      QHash<QPersistentModelIndex,_QEditorInfo>::clear(&this_00->indexEditorHash);
      QHash<QWidget_*,_QHashDummyValue>::clear(&(this_00->persistent).q_hash);
      this_00->currentIndexSet = false;
      *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
      local_68._0_8_ = (code *)0xffffffffffffffff;
      stack0xffffffffffffffa0 = (undefined1  [16])0x0;
      (**(code **)(*(long *)this + 0x218))(this);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->selectionModel);
      if (bVar2) {
        (**(code **)(*(long *)(this_00->selectionModel).wp.value + 0x80))();
      }
      cVar3 = QAccessible::isActive();
      if (cVar3 != '\0') {
        pQStack_58 = this;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = 0xffffffff;
        local_68._0_8_ = QIcon::QIcon;
        local_48 = 0xffffffff;
        uStack_44 = 0xffffffff;
        uStack_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        local_68._8_4_ = 0x116;
        QAccessible::updateAccessibility((QAccessibleEvent *)local_68);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)local_68);
      }
      QAbstractItemViewPrivate::updateGeometry(this_00);
      QHash<QPersistentModelIndex,_QEditorInfo>::~QHash(&local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pVar4 = QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
            ::operator*((QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
                         *)&local_80);
    this_01 = pVar4.second;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_01);
    if (bVar2) {
      pDVar1 = (this_01->widget).wp.d;
      if (pDVar1 == (Data *)0x0) {
        editor_00 = (QWidget *)0x0;
LAB_004e17e0:
        editor = (QWidget *)0x0;
      }
      else {
        if (*(int *)(pDVar1 + 4) == 0) {
          editor_00 = (QWidget *)0x0;
        }
        else {
          editor_00 = (QWidget *)(this_01->widget).wp.value;
        }
        if (*(int *)(pDVar1 + 4) == 0) goto LAB_004e17e0;
        editor = (QWidget *)(this_01->widget).wp.value;
      }
      QAbstractItemViewPrivate::indexForEditor((QModelIndex *)local_68,this_00,editor);
      QAbstractItemViewPrivate::releaseEditor(this_00,editor_00,(QModelIndex *)local_68);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::operator++
              (&local_80);
  } while( true );
}

Assistant:

void QAbstractItemView::reset()
{
    Q_D(QAbstractItemView);
    d->delayedReset.stop(); //make sure we stop the timer
    // Taking a copy because releaseEditor() eventurally calls deleteLater() on the
    // editor, which calls QCoreApplication::postEvent(), the latter may invoke unknown
    // code that may modify d->indexEditorHash.
    const auto copy = d->indexEditorHash;
    for (const auto &[index, info] : copy.asKeyValueRange()) {
        if (info.widget)
            d->releaseEditor(info.widget.data(), d->indexForEditor(info.widget.data()));
    }
    d->editorIndexHash.clear();
    d->indexEditorHash.clear();
    d->persistent.clear();
    d->currentIndexSet = false;
    setState(NoState);
    setRootIndex(QModelIndex());
    if (d->selectionModel)
        d->selectionModel->reset();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}